

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall QCss::Parser::parseRuleset(Parser *this,StyleRule *styleRule)

{
  uint uVar1;
  TokenType TVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> QVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  Symbol *pSVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> local_88;
  Declaration local_80;
  QArrayDataPointer<QCss::BasicSelector> local_78;
  QArrayDataPointer<QCss::BasicSelector> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (BasicSelector *)0x0;
  local_58.size = 0;
  bVar3 = parseSelector(this,(Selector *)&local_58);
  if (bVar3) {
    QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
              ((QMovableArrayOps<QCss::Selector> *)styleRule,(styleRule->selectors).d.size,
               (Selector *)&local_58);
    QList<QCss::Selector>::end(&styleRule->selectors);
    uVar8 = this->index;
    lVar9 = (long)(int)uVar8;
    lVar6 = (this->symbols).d.size;
    if (lVar9 < lVar6) {
      do {
        pSVar11 = (this->symbols).d.ptr;
        if (pSVar11[lVar9].token != COMMA) {
          lVar9 = (long)(int)uVar8;
          break;
        }
        this->index = uVar8 + 1;
        lVar10 = (long)(int)(uVar8 + 1);
        lVar9 = lVar6 - lVar10;
        if (lVar9 != 0 && lVar10 <= lVar6) {
          iVar14 = uVar8 + 2;
          pSVar11 = pSVar11 + lVar10;
          do {
            if (pSVar11->token != S) break;
            this->index = iVar14;
            iVar14 = iVar14 + 1;
            pSVar11 = pSVar11 + 1;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        local_78.d = (Data *)0x0;
        local_78.ptr = (BasicSelector *)0x0;
        local_78.size = 0;
        bVar3 = testSimpleSelector(this);
        if (!bVar3) {
          this->errorIndex = this->index;
LAB_005e2f78:
          QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_78);
          goto LAB_005e2f89;
        }
        bVar3 = parseSelector(this,(Selector *)&local_78);
        if (!bVar3) goto LAB_005e2f78;
        QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
                  ((QMovableArrayOps<QCss::Selector> *)styleRule,(styleRule->selectors).d.size,
                   (Selector *)&local_78);
        QList<QCss::Selector>::end(&styleRule->selectors);
        QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_78);
        uVar8 = this->index;
        lVar9 = (long)(int)uVar8;
        lVar6 = (this->symbols).d.size;
      } while (lVar9 < lVar6);
    }
    if (lVar9 < lVar6) {
      pSVar11 = (this->symbols).d.ptr;
      if (pSVar11[lVar9].token == S) {
        pSVar11 = pSVar11 + lVar9;
        lVar10 = -1;
        do {
          lVar13 = lVar10;
          pSVar11 = pSVar11 + 1;
          if (lVar9 - lVar6 == lVar13) break;
          lVar10 = lVar13 + -1;
        } while (pSVar11->token == S);
        uVar8 = (int)lVar9 - (int)lVar13;
        this->index = uVar8;
      }
      lVar9 = (long)(int)uVar8;
    }
    if (lVar9 < lVar6) {
      uVar8 = uVar8 + 1;
      this->index = uVar8;
      pSVar11 = (this->symbols).d.ptr;
      if (pSVar11[lVar9].token == LBRACE) {
        uVar12 = (ulong)uVar8;
        do {
          iVar14 = (int)uVar12;
          lVar10 = (long)iVar14;
          lVar9 = lVar6 - lVar10;
          if (lVar9 != 0 && lVar10 <= lVar6) {
            pSVar11 = pSVar11 + lVar10;
            do {
              iVar14 = iVar14 + 1;
              if (pSVar11->token != S) break;
              this->index = iVar14;
              pSVar11 = pSVar11 + 1;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          local_80.d.d.ptr =
               (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)operator_new(0x68);
          *(int *)local_80.d.d.ptr = 0;
          (((QString *)((long)local_80.d.d.ptr + 8))->d).d = (Data *)0x0;
          *(char16_t **)((long)local_80.d.d.ptr + 0x10) = (char16_t *)0x0;
          *(undefined8 *)((long)local_80.d.d.ptr + 0x14) = 0;
          ((int *)((long)local_80.d.d.ptr + 0x1c))[0] = 0;
          ((int *)((long)local_80.d.d.ptr + 0x1c))[1] = 0;
          (((QList<QCss::Value> *)((long)local_80.d.d.ptr + 0x28))->d).d = (Data *)0x0;
          *(Value **)((long)local_80.d.d.ptr + 0x30) = (Value *)0x0;
          *(qsizetype *)((long)local_80.d.d.ptr + 0x38) = 0;
          (((QVariant *)((long)local_80.d.d.ptr + 0x40))->d).data.shared = (PrivateShared *)0x0;
          *(qsizetype *)((long)local_80.d.d.ptr + 0x48) = 0;
          (((Data *)((long)local_80.d.d.ptr + 0x50))->super_QArrayData).ref_ = (Type)0x0;
          (((Data *)((long)local_80.d.d.ptr + 0x50))->super_QArrayData).flags =
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
          *(qsizetype *)((long)local_80.d.d.ptr + 0x58) = 2;
          *(undefined1 *)
           &(((Data *)((long)local_80.d.d.ptr + 0x60))->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i = 0;
          LOCK();
          *(int *)local_80.d.d.ptr = *(int *)local_80.d.d.ptr + 1;
          UNLOCK();
          iVar14 = this->index;
          bVar3 = parseNextDeclaration(this,&local_80);
          if (!bVar3) {
            this->index = iVar14;
            bVar3 = until(this,SEMICOLON,NONE);
            iVar14 = this->index;
            this->index = uVar8;
            bVar4 = until(this,RBRACE,NONE);
            iVar5 = this->index;
            if ((!bVar3) || (iVar5 <= iVar14)) {
              lVar10 = (long)iVar5;
              lVar6 = (this->symbols).d.size;
              lVar9 = lVar6 - lVar10;
              if (lVar9 == 0 || lVar6 < lVar10) goto LAB_005e2fe3;
              pSVar11 = (this->symbols).d.ptr + lVar10;
              goto LAB_005e2fd0;
            }
            QVar7.d.ptr = (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)
                          operator_new(0x68);
            *(int *)QVar7.d.ptr = 0;
            (((QString *)((long)QVar7.d.ptr + 8))->d).d = (Data *)0x0;
            *(char16_t **)((long)QVar7.d.ptr + 0x10) = (char16_t *)0x0;
            *(undefined8 *)((long)QVar7.d.ptr + 0x14) = 0;
            ((int *)((long)QVar7.d.ptr + 0x1c))[0] = 0;
            ((int *)((long)QVar7.d.ptr + 0x1c))[1] = 0;
            (((QList<QCss::Value> *)((long)QVar7.d.ptr + 0x28))->d).d = (Data *)0x0;
            *(Value **)((long)QVar7.d.ptr + 0x30) = (Value *)0x0;
            *(qsizetype *)((long)QVar7.d.ptr + 0x38) = 0;
            (((QVariant *)((long)QVar7.d.ptr + 0x40))->d).data.shared = (PrivateShared *)0x0;
            *(qsizetype *)((long)QVar7.d.ptr + 0x48) = 0;
            (((Data *)((long)QVar7.d.ptr + 0x50))->super_QArrayData).ref_ = (Type)0x0;
            (((Data *)((long)QVar7.d.ptr + 0x50))->super_QArrayData).flags =
                 (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
            *(qsizetype *)((long)QVar7.d.ptr + 0x58) = 2;
            *(undefined1 *)
             &(((Data *)((long)QVar7.d.ptr + 0x60))->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i = 0;
            LOCK();
            *(int *)QVar7.d.ptr = *(int *)QVar7.d.ptr + 1;
            UNLOCK();
            local_88.d.ptr =
                 (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)
                 (DeclarationData *)0x0;
            local_78.d = (Data *)local_80.d.d.ptr;
            local_80.d.d.ptr =
                 (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)
                 (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)QVar7.d.ptr;
            QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::
            ~QExplicitlySharedDataPointer
                      ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)&local_78
                      );
            QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::
            ~QExplicitlySharedDataPointer(&local_88);
            this->index = iVar14 + -1;
          }
          if ((*(qsizetype *)((long)local_80.d.d.ptr + 0x18) != 0) ||
             (*(Property *)((long)local_80.d.d.ptr + 0x20) != UnknownProperty)) {
            QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
                      ((QMovableArrayOps<QCss::Declaration> *)&styleRule->declarations,
                       (styleRule->declarations).d.size,&local_80);
            QList<QCss::Declaration>::end(&styleRule->declarations);
          }
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::
          ~QExplicitlySharedDataPointer(&local_80.d);
          uVar1 = this->index;
          lVar9 = (long)(int)uVar1;
          lVar6 = (this->symbols).d.size;
          if (lVar6 <= lVar9) {
            uVar12 = (ulong)uVar1;
            goto LAB_005e2f86;
          }
          pSVar11 = (this->symbols).d.ptr;
          uVar12 = lVar9 + 1;
          TVar2 = pSVar11[lVar9].token;
          this->index = (int)uVar12;
        } while (TVar2 == SEMICOLON);
        pSVar11 = (this->symbols).d.ptr;
        if (pSVar11[lVar9].token == RBRACE) {
          bVar4 = true;
          lVar9 = lVar6 - uVar12;
          if (lVar9 != 0 && (long)uVar12 <= lVar6) {
            iVar14 = uVar1 + 2;
            pSVar11 = pSVar11 + uVar12;
            do {
              if (pSVar11->token != S) break;
              this->index = iVar14;
              iVar14 = iVar14 + 1;
              pSVar11 = pSVar11 + 1;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          goto LAB_005e2f8b;
        }
LAB_005e2f86:
        this->errorIndex = (int)uVar12;
        goto LAB_005e2f89;
      }
    }
    this->errorIndex = uVar8;
  }
LAB_005e2f89:
  bVar4 = false;
LAB_005e2f8b:
  QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
  while( true ) {
    this->index = iVar5;
    pSVar11 = pSVar11 + 1;
    lVar9 = lVar9 + -1;
    if (lVar9 == 0) break;
LAB_005e2fd0:
    iVar5 = iVar5 + 1;
    if (pSVar11->token != S) break;
  }
LAB_005e2fe3:
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::~QExplicitlySharedDataPointer
            (&local_80.d);
  goto LAB_005e2f8b;
}

Assistant:

bool Parser::parseRuleset(StyleRule *styleRule)
{
    Selector sel;
    if (!parseSelector(&sel)) return false;
    styleRule->selectors.append(sel);

    while (test(COMMA)) {
        skipSpace();
        Selector sel;
        if (!parseNextSelector(&sel)) return false;
        styleRule->selectors.append(sel);
    }

    skipSpace();
    if (!next(LBRACE)) return false;
    const int declarationStart = index;

    do {
        skipSpace();
        Declaration decl;
        const int rewind = index;
        if (!parseNextDeclaration(&decl)) {
            index = rewind;
            const bool foundSemicolon = until(SEMICOLON);
            const int semicolonIndex = index;

            index = declarationStart;
            const bool foundRBrace = until(RBRACE);

            if (foundSemicolon && semicolonIndex < index) {
                decl = Declaration();
                index = semicolonIndex - 1;
            } else {
                skipSpace();
                return foundRBrace;
            }
        }
        if (!decl.isEmpty())
            styleRule->declarations.append(decl);
    } while (test(SEMICOLON));

    if (!next(RBRACE)) return false;
    skipSpace();
    return true;
}